

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void store_reg(DisasContext_conflict1 *s,int reg,TCGv_i32 var)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (reg == 0xf) {
    tcg_gen_andi_i32_aarch64(tcg_ctx,var,var,(uint)(s->thumb != 0) * 2 | 0xfffffffc);
    (s->base).is_jmp = DISAS_TARGET_0;
  }
  if (tcg_ctx->cpu_R[reg] != var) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(tcg_ctx->cpu_R[reg] + (long)tcg_ctx),
                        (TCGArg)(var + (long)&tcg_ctx->pool_cur));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  return;
}

Assistant:

static void store_reg(DisasContext *s, int reg, TCGv_i32 var)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (reg == 15) {
        /* In Thumb mode, we must ignore bit 0.
         * In ARM mode, for ARMv4 and ARMv5, it is UNPREDICTABLE if bits [1:0]
         * are not 0b00, but for ARMv6 and above, we must ignore bits [1:0].
         * We choose to ignore [1:0] in ARM mode for all architecture versions.
         */
        tcg_gen_andi_i32(tcg_ctx, var, var, s->thumb ? ~1 : ~3);
        s->base.is_jmp = DISAS_JUMP;
    }
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_R[reg], var);
    tcg_temp_free_i32(tcg_ctx, var);
}